

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

void VW::read_line_decision_service_json<false>
               (vw *all,v_array<example_*> *examples,char *line,size_t length,bool copy_line,
               example_factory_t example_factory,void *ex_factory_context,
               DecisionServiceInteraction *data)

{
  bool bVar1;
  ParseErrorCode parseErrorCode;
  ostream *poVar2;
  size_t sVar3;
  char *pcVar4;
  vw_exception *this;
  stringstream *psVar5;
  string *pmessage;
  ostream *poVar6;
  undefined8 uVar7;
  Ch *in_RDX;
  EVP_PKEY_CTX *in_RDI;
  byte in_R8B;
  ParseResult PVar8;
  DecisionServiceInteraction *in_stack_00000010;
  stringstream __msg;
  BaseState<false> *current_state;
  ParseResult result;
  VWReaderHandler<false> *handler;
  json_parser<false> parser;
  InsituStringStream ss;
  vector<char,_std::allocator<char>_> line_vec;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffae8;
  json_parser<false> *in_stack_fffffffffffffaf0;
  char *local_508;
  json_parser<false> *in_stack_fffffffffffffb00;
  VWReaderHandler<false> *in_stack_fffffffffffffb10;
  int plineNumber;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *in_stack_fffffffffffffb18;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
  *in_stack_fffffffffffffb20;
  char *in_stack_fffffffffffffb28;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffb30;
  const_iterator in_stack_fffffffffffffb38;
  string local_470 [32];
  stringstream local_450 [16];
  ostream local_440;
  BaseState<false> *local_2c8;
  ParseResult local_2c0;
  Context<false> *local_2b0;
  Context<false> local_268;
  GenericInsituStringStream<rapidjson::UTF8<char>_> local_88;
  char *local_70;
  char *local_58;
  byte local_21;
  Ch *local_18;
  EVP_PKEY_CTX *local_8;
  
  local_21 = in_R8B & 1;
  local_18 = in_RDX;
  local_8 = in_RDI;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x278d38);
  if ((local_21 & 1) != 0) {
    local_58 = (char *)std::vector<char,_std::allocator<char>_>::end(in_stack_fffffffffffffae8);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffffaf0,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffffae8);
    local_70 = (char *)std::vector<char,std::allocator<char>>::insert<char*,void>
                                 (in_stack_fffffffffffffb30,in_stack_fffffffffffffb38,
                                  in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
    local_18 = std::vector<char,_std::allocator<char>_>::front
                         ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffaf0);
  }
  rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>::GenericInsituStringStream
            (&local_88,local_18);
  json_parser<false>::json_parser(in_stack_fffffffffffffb00);
  local_2b0 = &local_268;
  VWReaderHandler<false>::init((VWReaderHandler<false> *)local_2b0,local_8);
  Context<false>::SetStartStateToDecisionService(local_2b0,in_stack_00000010);
  PVar8 = rapidjson::
          GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
          Parse<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
                    (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  local_2c0.offset_ = PVar8.offset_;
  local_2c0.code_ = PVar8.code_;
  bVar1 = rapidjson::ParseResult::IsError(&local_2c0);
  if (!bVar1) {
    json_parser<false>::~json_parser(in_stack_fffffffffffffaf0);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffb00);
    return;
  }
  local_2c8 = VWReaderHandler<false>::current_state((VWReaderHandler<false> *)local_2b0);
  std::__cxx11::stringstream::stringstream(local_450);
  poVar2 = std::operator<<(&local_440,"JSON parser error at ");
  sVar3 = rapidjson::ParseResult::Offset(&local_2c0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2,": ");
  parseErrorCode = rapidjson::ParseResult::Code(&local_2c0);
  pcVar4 = rapidjson::GetParseError_En(parseErrorCode);
  this = (vw_exception *)std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<((ostream *)this,". Handler: ");
  psVar5 = VWReaderHandler<false>::error_abi_cxx11_((VWReaderHandler<false> *)0x278fdb);
  plineNumber = (int)((ulong)psVar5 >> 0x20);
  std::__cxx11::stringstream::str();
  pmessage = (string *)std::operator<<(poVar2,local_470);
  poVar6 = std::operator<<((ostream *)pmessage,"State: ");
  if (local_2c8 == (BaseState<false> *)0x0) {
    local_508 = "null";
  }
  else {
    local_508 = local_2c8->name;
  }
  std::operator<<(poVar6,local_508);
  std::__cxx11::string::~string(local_470);
  uVar7 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  vw_exception::vw_exception(this,(char *)poVar2,plineNumber,pmessage);
  __cxa_throw(uVar7,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

void read_line_decision_service_json(vw& all, v_array<example*>& examples, char* line, size_t length, bool copy_line,
    example_factory_t example_factory, void* ex_factory_context, DecisionServiceInteraction* data)
{
  std::vector<char> line_vec;
  if (copy_line)
  {
    line_vec.insert(line_vec.end(), line, line + length);
    line = &line_vec.front();
  }

  InsituStringStream ss(line);
  json_parser<audit> parser;

  VWReaderHandler<audit>& handler = parser.handler;
  handler.init(&all, &examples, &ss, line + length, example_factory, ex_factory_context);
  handler.ctx.SetStartStateToDecisionService(data);

  ParseResult result =
      parser.reader.template Parse<kParseInsituFlag, InsituStringStream, VWReaderHandler<audit>>(ss, handler);

  if (!result.IsError())
    return;

  BaseState<audit>* current_state = handler.current_state();

  THROW("JSON parser error at " << result.Offset() << ": " << GetParseError_En(result.Code())
                                << ". "
                                   "Handler: "
                                << handler.error().str()
                                << "State: " << (current_state ? current_state->name : "null"));
}